

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_initFseState(ZSTD_fseState *DStatePtr,BIT_DStream_t *bitD,ZSTD_seqSymbol *dt)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  long in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  ZSTD_seqSymbol_header *DTableH;
  void *ptr;
  BIT_DStream_status result;
  U32 nbBytes;
  size_t value;
  U32 regMask;
  BIT_DStream_t *in_stack_ffffffffffffff68;
  uint local_64;
  
  uVar2 = in_RSI[1];
  bVar1 = (byte)*(int *)(in_RDX + 4);
  *(int *)(in_RSI + 1) = *(int *)(in_RDX + 4) + (int)in_RSI[1];
  *in_RDI = *in_RSI >> (('@' - (char)(int)uVar2) - bVar1 & 0x3f) & (1L << (bVar1 & 0x3f)) - 1U;
  if ((uint)in_RSI[1] < 0x41) {
    if (in_RSI[2] < in_RSI[4]) {
      if (in_RSI[2] != in_RSI[3]) {
        local_64 = (uint)in_RSI[1] >> 3;
        if (in_RSI[2] - (ulong)local_64 < in_RSI[3]) {
          local_64 = (int)in_RSI[2] - (int)in_RSI[3];
        }
        in_RSI[2] = in_RSI[2] - (ulong)local_64;
        *(uint *)(in_RSI + 1) = (int)in_RSI[1] + local_64 * -8;
        sVar3 = MEM_readLEST(in_stack_ffffffffffffff68);
        *in_RSI = sVar3;
      }
    }
    else {
      BIT_reloadDStreamFast(in_stack_ffffffffffffff68);
    }
  }
  in_RDI[1] = in_RDX + 8;
  return;
}

Assistant:

static void
ZSTD_initFseState(ZSTD_fseState* DStatePtr, BIT_DStream_t* bitD, const ZSTD_seqSymbol* dt)
{
    const void* ptr = dt;
    const ZSTD_seqSymbol_header* const DTableH = (const ZSTD_seqSymbol_header*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    DEBUGLOG(6, "ZSTD_initFseState : val=%u using %u bits",
                (U32)DStatePtr->state, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}